

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall chrono::ChValue::~ChValue(ChValue *this)

{
  code *pcVar1;
  ChValue *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~ChValue() {}